

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O0

void __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::WithinAbsMatcher
          (WithinAbsMatcher *this,string *msg,double target,double margin)

{
  double margin_local;
  double target_local;
  string *msg_local;
  WithinAbsMatcher *this_local;
  
  Catch::Matchers::MatcherBase<double>::MatcherBase(&this->super_MatcherBase<double>);
  (this->super_MatcherBase<double>).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__WithinAbsMatcher_003a1240;
  std::__cxx11::string::string((string *)&this->m_msg,(string *)msg);
  this->m_target = target;
  this->m_margin = margin;
  return;
}

Assistant:

WithinAbsMatcher::WithinAbsMatcher(std::string msg, double target, double margin)
        :m_msg{msg}, m_target{ target }, m_margin{ margin } {
    }